

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall LexerTest_LexLineComment_Test::TestBody(LexerTest_LexLineComment_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_278;
  AssertHelper local_258;
  Message local_250;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__2;
  Message local_228;
  int local_21c;
  _Optional_payload_base<unsigned_int> local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_3;
  Message local_1f8;
  TextPos local_1f0;
  TextPos local_1e0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__1;
  Message local_170;
  int local_164;
  _Optional_payload_base<unsigned_int> local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_1;
  Message local_140;
  TextPos local_138;
  TextPos local_128;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  string local_100;
  AssertHelper local_e0;
  Message local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  string_view local_78;
  undefined1 local_68 [8];
  Lexer lexer;
  LexerTest_LexLineComment_Test *this_local;
  
  lexer.buffer._M_str = (char *)this;
  local_78 = sv("1;; whee! 2 3\t4\r5\n6",0x13);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer((Lexer *)local_68,local_78,&local_a0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_a0);
  bVar1 = ::wasm::WATParser::Lexer::empty((Lexer *)local_68);
  local_c9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_100,(internal *)local_c8,(AssertionResult *)"lexer.empty()","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    testing::Message::~Message(&local_d8);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_128 = ::wasm::WATParser::Lexer::position((Lexer *)local_68);
    local_138.line = 1;
    local_138.col = 0;
    testing::internal::EqHelper::
    Compare<wasm::WATParser::TextPos,_wasm::WATParser::TextPos,_nullptr>
              ((EqHelper *)local_118,"lexer.position()","(TextPos{1, 0})",&local_128,&local_138);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x37,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_140);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    local_160 = (_Optional_payload_base<unsigned_int>)
                ::wasm::WATParser::Lexer::takeI32((Lexer *)local_68);
    local_164 = 1;
    testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_int,_nullptr>
              ((EqHelper *)local_158,"lexer.takeI32()","1",(optional<unsigned_int> *)&local_160,
               &local_164);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar1) {
      testing::Message::Message(&local_170);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x38,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    bVar1 = ::wasm::WATParser::Lexer::empty((Lexer *)local_68);
    local_189 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_188,&local_189,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_188,
                 (AssertionResult *)"lexer.empty()","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x3a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_198);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_1e0 = ::wasm::WATParser::Lexer::position((Lexer *)local_68);
      local_1f0.line = 2;
      local_1f0.col = 0;
      testing::internal::EqHelper::
      Compare<wasm::WATParser::TextPos,_wasm::WATParser::TextPos,_nullptr>
                ((EqHelper *)local_1d0,"lexer.position()","(TextPos{2, 0})",&local_1e0,&local_1f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1f8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x3b,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_1f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
      local_218 = (_Optional_payload_base<unsigned_int>)
                  ::wasm::WATParser::Lexer::takeI32((Lexer *)local_68);
      local_21c = 6;
      testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_int,_nullptr>
                ((EqHelper *)local_210,"lexer.takeI32()","6",(optional<unsigned_int> *)&local_218,
                 &local_21c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
      if (!bVar1) {
        testing::Message::Message(&local_228);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x3c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_228)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_228);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
      local_241 = ::wasm::WATParser::Lexer::empty((Lexer *)local_68);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_240,&local_241,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
      if (!bVar1) {
        testing::Message::Message(&local_250);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_278,(internal *)local_240,(AssertionResult *)"lexer.empty()","false",
                   "true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_258,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x3e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_258,&local_250);
        testing::internal::AssertHelper::~AssertHelper(&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        testing::Message::~Message(&local_250);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_68);
  return;
}

Assistant:

TEST(LexerTest, LexLineComment) {
  Lexer lexer("1;; whee! 2 3\t4\r5\n6"sv);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{1, 0}));
  EXPECT_EQ(lexer.takeI32(), 1);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{2, 0}));
  EXPECT_EQ(lexer.takeI32(), 6);

  EXPECT_TRUE(lexer.empty());
}